

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.cc
# Opt level: O0

auto_ptr<avro::InputStream> avro::memoryInputStream(OutputStream *source)

{
  bool bVar1;
  long lVar2;
  element_type *peVar3;
  undefined8 in_RSI;
  MemoryInputStream *in_RDI;
  MemoryOutputStream *mos;
  size_t in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *in_stack_ffffffffffffff98;
  MemoryInputStream *this;
  
  this = in_RDI;
  lVar2 = __dynamic_cast(in_RSI,&OutputStream::typeinfo,&MemoryOutputStream::typeinfo,0);
  if (lVar2 == 0) {
    __cxa_bad_cast();
  }
  bVar1 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::empty
                    ((vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)this);
  if (bVar1) {
    peVar3 = (element_type *)operator_new(0x20);
    MemoryInputStream2::MemoryInputStream2
              ((MemoryInputStream2 *)this,(uint8_t *)peVar3,in_stack_ffffffffffffff90);
    std::auto_ptr<avro::InputStream>::auto_ptr((auto_ptr<avro::InputStream> *)this,peVar3);
  }
  else {
    peVar3 = (element_type *)operator_new(0x38);
    MemoryInputStream::MemoryInputStream
              (this,in_stack_ffffffffffffff98,(size_t)peVar3,in_stack_ffffffffffffff88);
    std::auto_ptr<avro::InputStream>::auto_ptr((auto_ptr<avro::InputStream> *)this,peVar3);
  }
  return (auto_ptr<avro::InputStream>)&in_RDI->super_InputStream;
}

Assistant:

std::auto_ptr<InputStream> memoryInputStream(const OutputStream& source)
{
    const MemoryOutputStream& mos =
        dynamic_cast<const MemoryOutputStream&>(source);
    return (mos.data_.empty()) ?
        std::auto_ptr<InputStream>(new MemoryInputStream2(0, 0)) :
        std::auto_ptr<InputStream>(new MemoryInputStream(mos.data_,
            mos.chunkSize_,
            (mos.chunkSize_ - mos.available_)));
}